

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BuiltinVariableShader::shadePrimitives
          (BuiltinVariableShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  float *pfVar1;
  Vector<float,_4> *pVVar2;
  float fVar3;
  Vector<float,_4> local_1e0;
  Vec4 local_1d0;
  Vector<float,_4> local_1c0;
  Vec4 local_1b0;
  Vector<float,_4> local_1a0;
  Vec4 local_190;
  Vector<float,_4> local_180;
  int local_170;
  int primitiveID;
  Vec4 local_15c;
  Vector<float,_4> local_14c;
  Vec4 local_13c;
  Vector<float,_4> local_12c;
  Vec4 local_11c;
  undefined1 local_10c [8];
  GenericVec4 fragColor_1;
  Vector<float,_4> local_ec;
  float local_dc;
  undefined1 local_d8 [4];
  float pointSize;
  GenericVec4 fragColor;
  VertexPacket *vertex;
  undefined1 local_b8 [4];
  int packetNdx;
  Vec4 colors [4];
  undefined1 local_70 [8];
  Vec4 yellow;
  Vec4 blue;
  Vec4 green;
  Vec4 red;
  int invocationID_local;
  int numPackets_local;
  PrimitivePacket *packets_local;
  int verticesIn_local;
  GeometryEmitter *output_local;
  BuiltinVariableShader *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(green.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(blue.m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(yellow.m_data + 2),0.0,0.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_70,1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_b8,(Vector<float,_4> *)(green.m_data + 2))
  ;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colors[0].m_data + 2),(Vector<float,_4> *)(blue.m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colors[1].m_data + 2),(Vector<float,_4> *)(yellow.m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colors[2].m_data + 2),(Vector<float,_4> *)local_70);
  for (vertex._4_4_ = 0; vertex._4_4_ < numPackets; vertex._4_4_ = vertex._4_4_ + 1) {
    fragColor.v._8_8_ = packets[vertex._4_4_].vertices[0];
    if (*(int *)&(this->super_ShaderProgram).field_0x154 == 0) {
      rr::GenericVec4::GenericVec4((GenericVec4 *)local_d8);
      rr::GenericVec4::get<float>((GenericVec4 *)&local_ec);
      pfVar1 = tcu::Vector<float,_4>::x(&local_ec);
      local_dc = *pfVar1 + 1.0;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)&fragColor_1.v + 8),1.0,1.0,1.0,1.0);
      rr::GenericVec4::operator=
                ((GenericVec4 *)local_d8,(Vector<float,_4> *)((long)&fragColor_1.v + 8));
      rr::GeometryEmitter::EmitVertex
                (output,(Vec4 *)(fragColor.v._8_8_ + 8),local_dc,(GenericVec4 *)local_d8,
                 packets[vertex._4_4_].primitiveIDIn);
    }
    else if (*(int *)&(this->super_ShaderProgram).field_0x154 == 1) {
      rr::GenericVec4::GenericVec4((GenericVec4 *)local_10c);
      rr::GenericVec4::operator=
                ((GenericVec4 *)local_10c,
                 (Vector<float,_4> *)
                 (local_b8 + (long)(packets[vertex._4_4_].primitiveIDIn % 4) * 0x10));
      pVVar2 = (Vector<float,_4> *)(fragColor.v._8_8_ + 8);
      tcu::Vector<float,_4>::Vector(&local_12c,0.05,0.0,0.0,0.0);
      tcu::operator+((tcu *)&local_11c,pVVar2,&local_12c);
      rr::GeometryEmitter::EmitVertex
                (output,&local_11c,1.0,(GenericVec4 *)local_10c,packets[vertex._4_4_].primitiveIDIn)
      ;
      pVVar2 = (Vector<float,_4> *)(fragColor.v._8_8_ + 8);
      tcu::Vector<float,_4>::Vector(&local_14c,0.05,0.0,0.0,0.0);
      tcu::operator-((tcu *)&local_13c,pVVar2,&local_14c);
      rr::GeometryEmitter::EmitVertex
                (output,&local_13c,1.0,(GenericVec4 *)local_10c,packets[vertex._4_4_].primitiveIDIn)
      ;
      pVVar2 = (Vector<float,_4> *)(fragColor.v._8_8_ + 8);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffffe94,0.0,0.05,0.0,0.0);
      tcu::operator+((tcu *)&local_15c,pVVar2,(Vector<float,_4> *)&stack0xfffffffffffffe94);
      rr::GeometryEmitter::EmitVertex
                (output,&local_15c,1.0,(GenericVec4 *)local_10c,packets[vertex._4_4_].primitiveIDIn)
      ;
    }
    else if (*(int *)&(this->super_ShaderProgram).field_0x154 == 2) {
      rr::GenericVec4::get<float>((GenericVec4 *)&local_180);
      pfVar1 = tcu::Vector<float,_4>::x(&local_180);
      fVar3 = ::deFloatFloor(*pfVar1);
      local_170 = (int)fVar3 + 3;
      pVVar2 = (Vector<float,_4> *)(fragColor.v._8_8_ + 8);
      tcu::Vector<float,_4>::Vector(&local_1a0,0.05,0.0,0.0,0.0);
      tcu::operator+((tcu *)&local_190,pVVar2,&local_1a0);
      rr::GeometryEmitter::EmitVertex
                (output,&local_190,1.0,(GenericVec4 *)(fragColor.v._8_8_ + 0x20),local_170);
      pVVar2 = (Vector<float,_4> *)(fragColor.v._8_8_ + 8);
      tcu::Vector<float,_4>::Vector(&local_1c0,0.05,0.0,0.0,0.0);
      tcu::operator-((tcu *)&local_1b0,pVVar2,&local_1c0);
      rr::GeometryEmitter::EmitVertex
                (output,&local_1b0,1.0,(GenericVec4 *)(fragColor.v._8_8_ + 0x20),local_170);
      pVVar2 = (Vector<float,_4> *)(fragColor.v._8_8_ + 8);
      tcu::Vector<float,_4>::Vector(&local_1e0,0.0,0.05,0.0,0.0);
      tcu::operator+((tcu *)&local_1d0,pVVar2,&local_1e0);
      rr::GeometryEmitter::EmitVertex
                (output,&local_1d0,1.0,(GenericVec4 *)(fragColor.v._8_8_ + 0x20),local_170);
    }
    rr::GeometryEmitter::EndPrimitive(output);
  }
  return;
}

Assistant:

void BuiltinVariableShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);
	DE_UNREF(invocationID);

	const tcu::Vec4 red			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 green		= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue		= tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f);
	const tcu::Vec4 yellow		= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 colors[4]	= { red, green, blue, yellow };

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const rr::VertexPacket*	vertex = packets[packetNdx].vertices[0];

		if (m_test == TEST_POINT_SIZE)
		{
			rr::GenericVec4	fragColor;
			const float		pointSize = vertex->outputs[0].get<float>().x() + 1.0f;

			fragColor = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);
			output.EmitVertex(vertex->position, pointSize, &fragColor, packets[packetNdx].primitiveIDIn);
		}
		else if (m_test == TEST_PRIMITIVE_ID_IN)
		{
			rr::GenericVec4	fragColor;
			fragColor = colors[packets[packetNdx].primitiveIDIn % 4];

			output.EmitVertex(vertex->position + tcu::Vec4(0.05f, 0.0f,  0.0f, 0.0f), 1.0f, &fragColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(vertex->position - tcu::Vec4(0.05f, 0.0f,  0.0f, 0.0f), 1.0f, &fragColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(vertex->position + tcu::Vec4(0.0f,  0.05f, 0.0f, 0.0f), 1.0f, &fragColor, packets[packetNdx].primitiveIDIn);
		}
		else if (m_test == TEST_PRIMITIVE_ID)
		{
			const int primitiveID = (int)deFloatFloor(vertex->outputs[0].get<float>().x()) + 3;

			output.EmitVertex(vertex->position + tcu::Vec4(0.05f, 0.0f,  0.0f, 0.0f), 1.0f, vertex->outputs, primitiveID);
			output.EmitVertex(vertex->position - tcu::Vec4(0.05f, 0.0f,  0.0f, 0.0f), 1.0f, vertex->outputs, primitiveID);
			output.EmitVertex(vertex->position + tcu::Vec4(0.0f,  0.05f, 0.0f, 0.0f), 1.0f, vertex->outputs, primitiveID);
		}
		else
			DE_ASSERT(DE_FALSE);

		output.EndPrimitive();
	}
}